

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O0

KBOOL __thiscall KDIS::PDU::Attribute_PDU::operator==(Attribute_PDU *this,Attribute_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Attribute_PDU *Value_local;
  Attribute_PDU *this_local;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::SimulationIdentifier::operator!=(&this->m_OrigSimAddr,&Value->m_OrigSimAddr);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else if (this->m_ui8ExtPDUType == Value->m_ui8ExtPDUType) {
      if (this->m_ui8ExtProtocolVersion == Value->m_ui8ExtProtocolVersion) {
        if (this->m_ui32MasterRecType == Value->m_ui32MasterRecType) {
          if (this->m_ui8ActionCode == Value->m_ui8ActionCode) {
            if (this->m_ui16NumAttrRecSets == Value->m_ui16NumAttrRecSets) {
              bVar2 = std::operator!=(&this->m_vAttributeRecordSets,&Value->m_vAttributeRecordSets);
              if (bVar2) {
                this_local._7_1_ = false;
              }
              else {
                this_local._7_1_ = true;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Attribute_PDU::operator == ( const Attribute_PDU & Value ) const
{
    if( Header::operator        !=( Value ) )                      return false;
    if( m_OrigSimAddr           != Value.m_OrigSimAddr )           return false;
    if( m_ui8ExtPDUType         != Value.m_ui8ExtPDUType )         return false;
    if( m_ui8ExtProtocolVersion != Value.m_ui8ExtProtocolVersion ) return false;
    if( m_ui32MasterRecType     != Value.m_ui32MasterRecType )     return false;
    if( m_ui8ActionCode         != Value.m_ui8ActionCode )         return false;
    if( m_ui16NumAttrRecSets    != Value.m_ui16NumAttrRecSets )    return false;
    if( m_vAttributeRecordSets  != Value.m_vAttributeRecordSets )  return false;
    return true;
}